

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O0

Port * __thiscall kratos::PortBundleRef::get_port(PortBundleRef *this,string *name)

{
  bool bVar1;
  element_type *peVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar3 [16];
  string_view format_str;
  format_args args;
  undefined1 local_f0 [24];
  mapped_type *port_name;
  _Self local_a8;
  _Self local_a0;
  string *local_98;
  string *name_local;
  PortBundleRef *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  undefined1 *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_20;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_98 = name;
  name_local = (string *)this;
  local_a0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->name_mappings_,name);
  local_a8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->name_mappings_);
  bVar1 = std::operator==(&local_a0,&local_a8);
  if (!bVar1) {
    local_f0._16_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::at(&this->name_mappings_,local_98);
    Generator::get_port((Generator *)local_f0,(string *)this->generator);
    peVar2 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_f0);
    std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)local_f0);
    return peVar2;
  }
  port_name._3_1_ = 1;
  auVar3 = __cxa_allocate_exception(0x10);
  local_38 = &stack0xffffffffffffff38;
  local_40 = "Unable to find {0} in port bundle";
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_98;
  local_68.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::make_args_checked<std::__cxx11::string_const&,char[34],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)"Unable to find {0} in port bundle",(v7 *)local_98,auVar3._8_8_,
                  (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                  "Unable to find {0} in port bundle");
  local_50 = &local_68;
  local_78 = fmt::v7::to_string_view<char,_0>(local_40);
  local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&this_local;
  local_30 = local_50;
  local_20._M_allocated_capacity = (size_type)local_50;
  local_10 = local_50;
  local_20._8_8_ = local_28;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,0xd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_50->string);
  format_str.size_ = (size_t)this_local;
  format_str.data_ = (char *)local_78.size_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_80.values_;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)&stack0xffffffffffffff38,(detail *)local_78.data_,format_str,args);
  UserException::UserException(auVar3._0_8_,(string *)&stack0xffffffffffffff38);
  port_name._3_1_ = 0;
  __cxa_throw(auVar3._0_8_,&UserException::typeinfo,UserException::~UserException);
}

Assistant:

Port& PortBundleRef::get_port(const std::string& name) {
    if (name_mappings_.find(name) == name_mappings_.end())
        throw UserException(::format("Unable to find {0} in port bundle", name));
    auto const& port_name = name_mappings_.at(name);
    return *generator->get_port(port_name);
}